

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O1

void __thiscall
QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate(QAbstractFileEnginePrivate *this)

{
  ~QAbstractFileEnginePrivate(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate()
    = default;